

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O0

void __thiscall
soplex::
SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSimplifier(SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *old)

{
  Timer *pTVar1;
  long in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffffa8;
  
  *(undefined ***)(in_RDI->data)._M_elems = &PTR__SPxSimplifier_004f06a0;
  *(undefined8 *)((in_RDI->data)._M_elems + 2) = *(undefined8 *)(in_RSI + 8);
  (in_RDI->data)._M_elems[6] = *(uint *)(in_RSI + 0x18);
  (in_RDI->data)._M_elems[7] = *(uint *)(in_RSI + 0x1c);
  (in_RDI->data)._M_elems[8] = *(uint *)(in_RSI + 0x20);
  (in_RDI->data)._M_elems[9] = *(uint *)(in_RSI + 0x24);
  in_RDI->exp = *(int *)(in_RSI + 0x28);
  *(undefined4 *)&in_RDI->neg = *(undefined4 *)(in_RSI + 0x2c);
  in_RDI->fpclass = *(fpclass_type *)(in_RSI + 0x30);
  in_RDI->prec_elem = *(int32_t *)(in_RSI + 0x34);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_RDI,in_stack_ffffffffffffffa8);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_RDI,in_stack_ffffffffffffffa8);
  *(undefined8 *)in_RDI[3].data._M_elems = *(undefined8 *)(in_RSI + 0xa8);
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x3fccd4);
  pTVar1 = TimerFactory::createTimer((TYPE)((ulong)in_RSI >> 0x20));
  *(Timer **)((in_RDI->data)._M_elems + 4) = pTVar1;
  return;
}

Assistant:

SPxSimplifier(const SPxSimplifier& old)
      : m_name(old.m_name)
      , m_timerType(old.m_timerType)
      , m_remRows(old.m_remRows)
      , m_remCols(old.m_remCols)
      , m_remNzos(old.m_remNzos)
      , m_chgBnds(old.m_chgBnds)
      , m_chgLRhs(old.m_chgLRhs)
      , m_keptBnds(old.m_keptBnds)
      , m_keptLRhs(old.m_keptLRhs)
      , m_objoffset(old.m_objoffset)
      , m_minReduction(old.m_minReduction)
      , spxout(old.spxout)
   {
      m_timeUsed = TimerFactory::createTimer(m_timerType);
      assert(isConsistent());
   }